

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O2

void __thiscall wasm::StringLowering::updateTypes(StringLowering *this,Module *module)

{
  pointer *__args;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  undefined1 auVar3 [8];
  int iVar4;
  pointer pHVar5;
  bool bVar6;
  FeatureSet FVar7;
  size_t sVar8;
  Type *pTVar9;
  mapped_type *pmVar10;
  pointer puVar11;
  undefined1 auVar12 [8];
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar13;
  optional<wasm::HeapType> oVar14;
  undefined1 auStack_198 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  undefined1 auStack_e8 [8];
  TypeUpdates updates;
  Signature local_a8;
  StringLowering *local_98;
  Module *local_90;
  pointer local_88;
  undefined1 local_80 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> allTypes;
  HeapType array16;
  undefined1 auStack_58 [8];
  Iterator __begin3;
  anon_class_1_0_00000001 local_31 [8];
  anon_class_1_0_00000001 fix;
  
  local_88 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __args = &allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  local_98 = this;
  local_90 = module;
  for (puVar11 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != local_88;
      puVar11 = puVar11 + 1) {
    auStack_198 = (undefined1  [8])
                  HeapType::getRecGroup
                            (&((puVar11->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type);
    sVar8 = RecGroup::size((RecGroup *)auStack_198);
    if ((sVar8 == 1) &&
       (FVar7 = HeapType::getFeatures
                          (&((puVar11->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type),
       (FVar7.features >> 0xe & 1) != 0)) {
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      updates._M_h._M_bucket_count = 0;
      auStack_198 = (undefined1  [8])0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      auStack_e8 = (undefined1  [8])0x0;
      updates._M_h._M_buckets = (__buckets_ptr)0x0;
      _local_80 = HeapType::getSignature
                            (&((puVar11->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type);
      auStack_58 = (undefined1  [8])local_80;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar13 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)auStack_58);
      for (; PVar1.index = (size_t)__begin3.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar1.parent = (Type *)auStack_58, PVar13 != PVar1;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        pTVar9 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
        allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)updateTypes::anon_class_1_0_00000001::operator()(local_31,(Type)pTVar9->id);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_198,(Type *)__args);
      }
      _local_80 = HeapType::getSignature
                            (&((puVar11->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type);
      auStack_58 = (undefined1  [8])&allTypes;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar13 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)auStack_58);
      for (; PVar2.index = (size_t)__begin3.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar2.parent = (Type *)auStack_58, PVar13 != PVar2;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        pTVar9 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
        allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)updateTypes::anon_class_1_0_00000001::operator()(local_31,(Type)pTVar9->id);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_e8,(Type *)__args);
      }
      wasm::Type::Type(&local_a8.params,(Tuple *)auStack_198);
      wasm::Type::Type(&local_a8.results,(Tuple *)auStack_e8);
      HeapType::HeapType((HeapType *)local_80,local_a8);
      (((puVar11->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
        _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type).id = (uintptr_t)local_80
      ;
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_e8);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_198);
    }
  }
  auStack_e8 = (undefined1  [8])&updates._M_h._M_rehash_policy._M_next_resize;
  updates._M_h._M_buckets = (__buckets_ptr)0x1;
  updates._M_h._M_bucket_count = 0;
  updates._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  updates._M_h._M_element_count._0_4_ = 0x3f800000;
  updates._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  updates._M_h._M_rehash_policy._4_4_ = 0;
  updates._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_198 = (undefined1  [8])0x50;
  pmVar10 = std::__detail::
            _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)auStack_e8,(key_type *)auStack_198);
  pmVar10->id = 8;
  wasm::ModuleUtils::collectHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_80,local_90);
  allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)wasm::Type::getHeapType(&local_98->nullArray16);
  HeapType::getArray((HeapType *)auStack_198);
  auVar3 = auStack_198;
  local_88 = (pointer)CONCAT44(local_88._4_4_,
                               (int)params.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
  iVar4 = params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_;
  pHVar5 = allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (auVar12 = local_80; auVar12 != (undefined1  [8])pHVar5;
      auVar12 = (undefined1  [8])((long)auVar12 + 8)) {
    auStack_58 = (undefined1  [8])((pointer)auVar12)->id;
    bVar6 = HeapType::isArray((HeapType *)auStack_58);
    if ((((bVar6) &&
         (oVar14 = HeapType::getDeclaredSuperType((HeapType *)auStack_58),
         ((undefined1  [16])
          oVar14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
         (undefined1  [16])0x0)) && (bVar6 = HeapType::isOpen((HeapType *)auStack_58), !bVar6)) &&
       (HeapType::getArray((HeapType *)auStack_198), auStack_198 == auVar3)) {
      if (((int)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start == (int)local_88) &&
         (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ == iVar4)) {
        pmVar10 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)auStack_e8,(HeapType *)auStack_58);
        pmVar10->id = (uintptr_t)
                      allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
    }
  }
  TypeMapper::TypeMapper((TypeMapper *)auStack_198,local_90,(TypeUpdates *)auStack_e8);
  auStack_58 = (undefined1  [8])0x0;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  TypeMapper::map((TypeMapper *)auStack_198,
                  (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
  TypeMapper::~TypeMapper((TypeMapper *)auStack_198);
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_80);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_e8);
  return;
}

Assistant:

void updateTypes(Module* module) {
    // TypeMapper will not handle public types, but we do want to modify them as
    // well: we are modifying the public ABI here. We can't simply tell
    // TypeMapper to consider them private, as then they'd end up in the new big
    // rec group with the private types (and as they are public, that would make
    // the entire rec group public, and all types in the module with it).
    // Instead, manually handle singleton-rec groups of function types. This
    // keeps them at size 1, as expected, and handles the cases of function
    // imports and exports. If we need more (non-function types, non-singleton
    // rec groups, etc.) then more work will be necessary TODO
    //
    // Note that we do this before TypeMapper, which allows it to then fix up
    // things like the types of parameters (which depend on the type of the
    // function, which must be modified either in TypeMapper - but as just
    // explained we cannot do that - or before it, which is what we do here).
    for (auto& func : module->functions) {
      if (func->type.getRecGroup().size() != 1 ||
          !func->type.getFeatures().hasStrings()) {
        continue;
      }

      // Fix up the stringrefs in this type that uses strings and is in a
      // singleton rec group.
      std::vector<Type> params, results;
      auto fix = [](Type t) {
        if (t.isRef() && t.getHeapType().isMaybeShared(HeapType::string)) {
          auto share = t.getHeapType().getShared();
          t = Type(HeapTypes::ext.getBasic(share), t.getNullability());
        }
        return t;
      };
      for (auto param : func->type.getSignature().params) {
        params.push_back(fix(param));
      }
      for (auto result : func->type.getSignature().results) {
        results.push_back(fix(result));
      }
      func->type = Signature(params, results);
    }

    TypeMapper::TypeUpdates updates;

    // Strings turn into externref.
    updates[HeapType::string] = HeapType::ext;

    // The module may have its own array16 type inside a big rec group, but
    // imported strings expects that type in its own rec group as part of the
    // ABI. Fix that up here. (This is valid to do as this type has no sub- or
    // super-types anyhow; it is "plain old data" for communicating with the
    // outside.)
    auto allTypes = ModuleUtils::collectHeapTypes(*module);
    auto array16 = nullArray16.getHeapType();
    auto array16Element = array16.getArray().element;
    for (auto type : allTypes) {
      // Match an array type with no super and that is closed.
      if (type.isArray() && !type.getDeclaredSuperType() && !type.isOpen() &&
          type.getArray().element == array16Element) {
        updates[type] = array16;
      }
    }

    TypeMapper(*module, updates).map();
  }